

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O2

int wally_tx_to_hex(wally_tx *tx,uint32_t flags,char **output)

{
  int iVar1;
  size_t is_elements;
  
  is_elements = 0;
  iVar1 = wally_tx_is_elements(tx,&is_elements);
  if (iVar1 == 0) {
    iVar1 = tx_to_hex_or_txid(tx,flags,output,(uchar *)0x0,0,is_elements != 0);
  }
  else {
    iVar1 = -2;
  }
  return iVar1;
}

Assistant:

int wally_tx_to_hex(const struct wally_tx *tx, uint32_t flags,
                    char **output)
{
    size_t is_elements = 0;

#ifdef BUILD_ELEMENTS
    if (wally_tx_is_elements(tx, &is_elements) != WALLY_OK)
        return WALLY_EINVAL;
#endif
    return tx_to_hex_or_txid(tx, flags, output, NULL, 0, is_elements);
}